

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaHeat2D_kry.c
# Opt level: O0

int SetInitialProfile(UserData data,N_Vector uu,N_Vector up,N_Vector res)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  void *in_RCX;
  N_Vector in_RDX;
  N_Vector in_RSI;
  N_Vector in_RDI;
  double dVar4;
  double dVar5;
  sunrealtype unaff_retaddr;
  sunrealtype *updata;
  sunrealtype *udata;
  sunrealtype yfact;
  sunrealtype xfact;
  sunindextype loc;
  sunindextype offset;
  sunindextype j;
  sunindextype i;
  sunindextype mm1;
  sunindextype mm;
  long local_40;
  long local_38;
  
  pvVar1 = in_RDI->content;
  lVar2 = N_VGetArrayPointer(in_RSI);
  lVar3 = N_VGetArrayPointer(in_RDX);
  for (local_40 = 0; local_40 < (long)pvVar1; local_40 = local_40 + 1) {
    dVar4 = (double)in_RDI->ops * (double)local_40;
    for (local_38 = 0; local_38 < (long)pvVar1; local_38 = local_38 + 1) {
      dVar5 = (double)in_RDI->ops * (double)local_38;
      *(double *)(lVar2 + ((long)pvVar1 * local_40 + local_38) * 8) =
           dVar5 * 16.0 * (1.0 - dVar5) * dVar4 * (1.0 - dVar4);
    }
  }
  N_VConst(0,in_RDX);
  resHeat(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX);
  N_VScale(0xbff0000000000000,in_RCX,in_RDX);
  for (local_40 = 0; local_40 < (long)pvVar1; local_40 = local_40 + 1) {
    for (local_38 = 0; local_38 < (long)pvVar1; local_38 = local_38 + 1) {
      if ((((local_40 == 0) || (local_40 == (long)pvVar1 + -1)) || (local_38 == 0)) ||
         (local_38 == (long)pvVar1 + -1)) {
        *(undefined8 *)(lVar3 + ((long)pvVar1 * local_40 + local_38) * 8) = 0;
      }
    }
  }
  return 0;
}

Assistant:

static int SetInitialProfile(UserData data, N_Vector uu, N_Vector up, N_Vector res)
{
  sunindextype mm, mm1, i, j, offset, loc;
  sunrealtype xfact, yfact, *udata, *updata;

  mm = data->mm;

  udata  = N_VGetArrayPointer(uu);
  updata = N_VGetArrayPointer(up);

  /* Initialize uu on all grid points. */
  mm1 = mm - 1;
  for (j = 0; j < mm; j++)
  {
    yfact  = data->dx * j;
    offset = mm * j;
    for (i = 0; i < mm; i++)
    {
      xfact      = data->dx * i;
      loc        = offset + i;
      udata[loc] = SUN_RCONST(16.0) * xfact * (ONE - xfact) * yfact *
                   (ONE - yfact);
    }
  }

  /* Initialize up vector to 0. */
  N_VConst(ZERO, up);

  /* resHeat sets res to negative of ODE RHS values at interior points. */
  resHeat(ZERO, uu, up, res, data);

  /* Copy -res into up to get correct interior initial up values. */
  N_VScale(-ONE, res, up);

  /* Set up at boundary points to zero. */
  for (j = 0; j < mm; j++)
  {
    offset = mm * j;
    for (i = 0; i < mm; i++)
    {
      loc = offset + i;
      if (j == 0 || j == mm1 || i == 0 || i == mm1) { updata[loc] = ZERO; }
    }
  }

  return (0);
}